

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1ba5289::WSHDescriptor::MakeScripts
          (WSHDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *param_2,
          Span<const_CScript> scripts,FlatSigningProvider *out)

{
  long lVar1;
  size_type sVar2;
  CScriptID *this_00;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> *ret;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Span<const_CScript> *in_stack_fffffffffffffec8;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *this_01;
  CScript *in_stack_fffffffffffffef8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  Span<const_CScript>::operator[]
            (in_stack_fffffffffffffec8,CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
            );
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)this_01,(CScript *)in_RDI);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffec8,
             (WitnessV0ScriptHash *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  GetScriptForDestination(in_stack_fffffffffffffeb8);
  Vector<CScript>(in_stack_fffffffffffffef8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffeb8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffffeb8);
  sVar2 = std::vector<CScript,_std::allocator<CScript>_>::size
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffeb8);
  if (sVar2 != 0) {
    this_00 = (CScriptID *)(in_R9 + 8);
    Span<const_CScript>::operator[]
              (in_stack_fffffffffffffec8,
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    CScriptID::CScriptID(this_00,(CScript *)in_stack_fffffffffffffec8);
    Span<const_CScript>::operator[]
              (in_stack_fffffffffffffec8,
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::
    map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>::
    emplace<CScriptID,CScript_const&>(in_RDI,this_00,(CScript *)in_stack_fffffffffffffec8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CScript,_std::allocator<CScript>_> *)this_01;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        auto ret = Vector(GetScriptForDestination(WitnessV0ScriptHash(scripts[0])));
        if (ret.size()) out.scripts.emplace(CScriptID(scripts[0]), scripts[0]);
        return ret;
    }